

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O1

Object * __thiscall nvim::Nvim::get_vvar(Object *__return_storage_ptr__,Nvim *this,string *name)

{
  string local_40;
  
  (__return_storage_ptr__->super_variant<_cf2d41c5_>).which_ = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nvim_get_vvar","");
  NvimRPC::call<std::__cxx11::string>(&this->client_,&local_40,__return_storage_ptr__,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Nvim::get_vvar(const std::string& name) {
    Object res;
    client_.call("nvim_get_vvar", res, name);
    return res;
}